

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingCompressionState<unsigned_long,_true,_long>::FlushSegment
          (BitpackingCompressionState<unsigned_long,_true,_long> *this)

{
  bool bVar1;
  long *plVar2;
  unsigned_long uVar3;
  idx_t iVar4;
  unsigned_long __n;
  InternalException *this_00;
  ulong uVar5;
  allocator local_81;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_80;
  BufferHandle *local_78;
  ColumnCheckpointState *local_70;
  BufferHandle local_68;
  string local_50;
  
  local_70 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  local_78 = &this->handle;
  plVar2 = (long *)BufferHandle::Ptr(local_78);
  uVar3 = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)this->data_ptr - (long)plVar2);
  iVar4 = CompressionInfo::GetBlockSize(&(this->super_CompressionState).info);
  __n = NumericCastImpl<unsigned_long,_long,_false>::Convert
                  ((long)((long)plVar2 + (iVar4 - (long)this->metadata_ptr)));
  bVar1 = CanStore(this,0,0);
  if (bVar1) {
    uVar5 = uVar3 + 7 & 0xfffffffffffffff8;
    if (uVar5 - uVar3 != 0) {
      switchD_0049f7f1::default((data_ptr_t)(uVar3 + (long)plVar2),0,uVar5 - uVar3);
    }
    memmove((data_ptr_t)((long)plVar2 + uVar5),this->metadata_ptr,__n);
    *plVar2 = __n + uVar5;
    local_80._M_head_impl =
         (this->current_segment).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    (this->current_segment).
    super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
    super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
    BufferHandle::BufferHandle(&local_68,local_78);
    (*local_70->_vptr_ColumnCheckpointState[4])(local_70,&local_80,&local_68,__n + uVar5);
    BufferHandle::~BufferHandle(&local_68);
    ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
                &local_80);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Error in bitpacking size calculation",&local_81);
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void FlushSegment() {
		auto &state = checkpoint_data.GetCheckpointState();
		auto base_ptr = handle.Ptr();

		// Compact the segment by moving the metadata next to the data.

		idx_t unaligned_offset = NumericCast<idx_t>(data_ptr - base_ptr);
		idx_t metadata_offset = AlignValue(unaligned_offset);
		idx_t metadata_size = NumericCast<idx_t>(base_ptr + info.GetBlockSize() - metadata_ptr);
		idx_t total_segment_size = metadata_offset + metadata_size;

		// Asserting things are still sane here
		if (!CanStore(0, 0)) {
			throw InternalException("Error in bitpacking size calculation");
		}

		if (unaligned_offset != metadata_offset) {
			// zero initialize any padding bits
			memset(base_ptr + unaligned_offset, 0, metadata_offset - unaligned_offset);
		}
		memmove(base_ptr + metadata_offset, metadata_ptr, metadata_size);

		// Store the offset of the metadata of the first group (which is at the highest address).
		Store<idx_t>(metadata_offset + metadata_size, base_ptr);

		state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
	}